

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O1

Publication * __thiscall helics::ValueFederate::getPublication(ValueFederate *this,string_view name)

{
  ValueFederateManager *this_00;
  Publication *pPVar1;
  string_view key;
  string local_48;
  
  pPVar1 = ValueFederateManager::getPublication
                     ((this->vfManager)._M_t.
                      super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                      .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl,
                      name);
  if ((pPVar1->super_Interface).handle.hid == -1700000000) {
    this_00 = (this->vfManager)._M_t.
              super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
              .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl;
    Federate::localNameGenerator_abi_cxx11_
              (&local_48,
               (Federate *)((long)&this->_vptr_ValueFederate + (long)this->_vptr_ValueFederate[-3]),
               (string_view)name);
    key._M_str = local_48._M_dataplus._M_p;
    key._M_len = local_48._M_string_length;
    pPVar1 = ValueFederateManager::getPublication(this_00,key);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return pPVar1;
}

Assistant:

Publication& ValueFederate::getPublication(std::string_view name)
{
    auto& pub = vfManager->getPublication(name);
    if (!pub.isValid()) {
        return vfManager->getPublication(localNameGenerator(name));
    }
    return pub;
}